

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_16x4(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  int16_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int16_t *tmp;
  int16_t *topR;
  int16_t *topL;
  
  if (in_R8D != 0) {
    in_RDI = in_RDI + 0x10;
  }
  load_buffer_8x4(in_RSI,(__m128i *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  load_buffer_8x4(in_RSI,(__m128i *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

static inline void load_buffer_16x4(const int16_t *input, __m128i *out,
                                    int stride, int flipud, int fliplr,
                                    int shift) {
  const int16_t *topL = input;
  const int16_t *topR = input + 8;

  const int16_t *tmp;

  if (fliplr) {
    tmp = topL;
    topL = topR;
    topR = tmp;
  }

  load_buffer_8x4(topL, out, stride, flipud, fliplr, shift);
  load_buffer_8x4(topR, out + 8, stride, flipud, fliplr, shift);
}